

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_lib.cc
# Opt level: O0

int X509V3_EXT_free(int nid,void *ext_data)

{
  X509V3_EXT_METHOD *pXVar1;
  X509V3_EXT_METHOD *ext_method;
  void *ext_data_local;
  int nid_local;
  
  pXVar1 = X509V3_EXT_get_nid(nid);
  if (pXVar1 != (X509V3_EXT_METHOD *)0x0) {
    ASN1_item_free((ASN1_VALUE *)ext_data,pXVar1->it);
  }
  else {
    ERR_put_error(0x14,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_lib.cc"
                  ,0x60);
  }
  ext_data_local._4_4_ = (uint)(pXVar1 != (X509V3_EXT_METHOD *)0x0);
  return ext_data_local._4_4_;
}

Assistant:

int X509V3_EXT_free(int nid, void *ext_data) {
  const X509V3_EXT_METHOD *ext_method = X509V3_EXT_get_nid(nid);
  if (ext_method == NULL) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_CANNOT_FIND_FREE_FUNCTION);
    return 0;
  }

  ASN1_item_free(reinterpret_cast<ASN1_VALUE *>(ext_data),
                 ASN1_ITEM_ptr(ext_method->it));
  return 1;
}